

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O0

int32_t __thiscall
cornelich::cycle_formatter_yyyymmdd::cycle_from_date_impl
          (cycle_formatter_yyyymmdd *this,string *date)

{
  bool bVar1;
  long lVar2;
  int64_t iVar3;
  long *in_FS_OFFSET;
  int64_t unix_timestamp;
  time_point ts;
  string *date_local;
  cycle_formatter_yyyymmdd *this_local;
  
  ts.__d.__r = (duration)(duration)date;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 8) {
    bVar1 = parse_date((string *)ts.__d.__r,(day_point *)(*in_FS_OFFSET + -0x14));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::chrono::
      time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
      ::time_point<std::chrono::duration<int,std::ratio<86400l,1l>>,void>
                ((time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                  *)&unix_timestamp,
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>
                  *)(*in_FS_OFFSET + -0x14));
      iVar3 = get_epoch_seconds((time_point *)&unix_timestamp);
      this_local._4_4_ =
           (int32_t)((iVar3 * 1000) / (long)(this->super_cycle_formatter).m_cycle_length);
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

std::int32_t cycle_formatter_yyyymmdd::cycle_from_date_impl(const std::string & date) const
{
    thread_local day_point dp;
    if(BOOST_UNLIKELY(date.length() != 8))
        return -1;
    if(BOOST_UNLIKELY(!parse_date(date, dp)))
        return -1;
    system_clock::time_point ts = dp;
    auto unix_timestamp = get_epoch_seconds(ts);

    return unix_timestamp * 1000 / m_cycle_length;
}